

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

bool __thiscall FIX::Acceptor::isLoggedOn(Acceptor *this)

{
  _Rb_tree_header *p_Var1;
  Sessions sessions;
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  _Stack_38;
  
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::_Rb_tree(&_Stack_38,&(this->m_sessions)._M_t);
  p_Var1 = &_Stack_38._M_impl.super__Rb_tree_header;
  while (((_Rb_tree_header *)_Stack_38._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1 &&
         ((*(byte *)((long)&_Stack_38._M_impl.super__Rb_tree_header._M_header._M_left[0xc]._M_parent
                            [0x13]._M_color + 1) != 1 ||
          ((_Stack_38._M_impl.super__Rb_tree_header._M_header._M_left[0xc]._M_parent[0x13]._M_color
           & 0x1000000) == _S_red))))) {
    _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::_Rb_tree_increment(_Stack_38._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::~_Rb_tree(&_Stack_38);
  return (_Rb_tree_header *)_Stack_38._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1;
}

Assistant:

bool Acceptor::isLoggedOn()
{
  Sessions sessions = m_sessions;
  Sessions::iterator i = sessions.begin();
  for ( ; i != sessions.end(); ++i )
  {
    if( i->second->isLoggedOn() )
      return true;
  }
  return false;
}